

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

IColourImpl * Catch::anon_unknown_23::platformColourInstance(void)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  undefined **ppuVar5;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x20);
    ppuVar5 = &PTR__Context_001bac90;
    *IMutableContext::currentContext = &PTR__Context_001bac90;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
  }
  else {
    ppuVar5 = (undefined **)*IMutableContext::currentContext;
  }
  plVar4 = (long *)(*(code *)ppuVar5[4])();
  if (plVar4 == (long *)0x0) {
LAB_0014cb83:
    iVar2 = isatty(1);
    if (iVar2 == 0) {
LAB_0014cb9a:
      ppuVar5 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
      goto LAB_0014cba1;
    }
  }
  else {
    iVar2 = (**(code **)(*plVar4 + 0x90))(plVar4);
    if (iVar2 != 1) {
      if (iVar2 == 0) goto LAB_0014cb83;
      goto LAB_0014cb9a;
    }
  }
  ppuVar5 = (undefined **)&(anonymous_namespace)::PosixColourImpl::instance()::s_instance;
LAB_0014cba1:
  *piVar3 = iVar1;
  return (IColourImpl *)ppuVar5;
}

Assistant:

ErrnoGuard::~ErrnoGuard() { errno = m_oldErrno; }